

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

int __thiscall
btAlignedObjectArray<btPlane>::copy
          (btAlignedObjectArray<btPlane> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  long in_RCX;
  btPlane *pbVar2;
  int i;
  btPlane *dest_local;
  int end_local;
  int start_local;
  btAlignedObjectArray<btPlane> *this_local;
  
  for (i = (int)dst; i < (int)src; i = i + 1) {
    puVar1 = (undefined8 *)(in_RCX + (long)i * 0x14);
    pbVar2 = this->m_data + i;
    *puVar1 = *(undefined8 *)(pbVar2->normal).m_floats;
    puVar1[1] = *(undefined8 *)((pbVar2->normal).m_floats + 2);
    *(btScalar *)(puVar1 + 2) = pbVar2->dist;
  }
  return i;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}